

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O0

void __thiscall
QDBusMenuLayoutItem::populate
          (QDBusMenuLayoutItem *this,QDBusPlatformMenuItem *item,int depth,
          QStringList *propertyNames)

{
  long lVar1;
  int iVar2;
  QPlatformMenu *pQVar3;
  QStringList *in_RCX;
  int in_EDX;
  QDBusPlatformMenu *in_RSI;
  QDBusMenuLayoutItem *in_RDI;
  long in_FS_OFFSET;
  QDBusPlatformMenu *menu;
  QDBusMenuItem proxy;
  QDBusPlatformMenuItem *in_stack_00000158;
  QDBusMenuItem *in_stack_00000160;
  QMap<QString,_QVariant> *in_stack_ffffffffffffffc0;
  QDBusMenuLayoutItem *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  iVar2 = QDBusPlatformMenuItem::dbusID((QDBusPlatformMenuItem *)in_RSI);
  *(int *)&(((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              *)&in_RDI->m_id)->d).ptr = iVar2;
  QDBusMenuItem::QDBusMenuItem(in_stack_00000160,in_stack_00000158);
  QMap<QString,_QVariant>::operator=(in_stack_ffffffffffffffc0,(QMap<QString,_QVariant> *)in_RDI);
  pQVar3 = QDBusPlatformMenuItem::menu((QDBusPlatformMenuItem *)in_RSI);
  if ((in_EDX != 0) && (pQVar3 != (QPlatformMenu *)0x0)) {
    populate(this_00,in_RSI,in_EDX,in_RCX);
  }
  QDBusMenuItem::~QDBusMenuItem((QDBusMenuItem *)0xaf60a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuLayoutItem::populate(const QDBusPlatformMenuItem *item, int depth, const QStringList &propertyNames)
{
    m_id = item->dbusID();
    QDBusMenuItem proxy(item);
    m_properties = proxy.m_properties;

    const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());
    if (depth != 0 && menu)
        populate(menu, depth, propertyNames);
}